

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFromMaterial
          (FBXConverter *this,PropertyTable *props,string *baseName,bool *result)

{
  undefined1 in_R8B;
  aiColor3D aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  bool local_30;
  bool *result_local;
  string *baseName_local;
  PropertyTable *props_local;
  FBXConverter *this_local;
  ai_real aVar1;
  
  result_local = result;
  baseName_local = baseName;
  props_local = props;
  this_local = this;
  local_30 = (bool)in_R8B;
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result,"Color"
                );
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result_local,
                 "Factor");
  aVar2 = GetColorPropertyFactored(this,props,baseName,&local_50,(bool *)&local_70,local_30);
  aVar1 = aVar2.b;
  std::__cxx11::string::~string((string *)&local_70);
  aVar2._0_8_ = std::__cxx11::string::~string((string *)&local_50);
  aVar2.b = aVar1;
  return aVar2;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFromMaterial(const PropertyTable& props, const std::string& baseName,
            bool& result)
        {
            return GetColorPropertyFactored(props, baseName + "Color", baseName + "Factor", result, true);
        }